

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCubicSpline.h
# Opt level: O1

void __thiscall chrono::ChCubicSpline::~ChCubicSpline(ChCubicSpline *this)

{
  pointer pdVar1;
  
  pdVar1 = (this->m_ypp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->m_ypp).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar1 = (this->m_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->m_y).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
  }
  pdVar1 = (this->m_t).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1,(long)(this->m_t).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
    return;
  }
  return;
}

Assistant:

class ChApi ChCubicSpline {
  public:
    enum BCType {
        DEFAULT_BC,  ///< quadratic function over corresponding interval (first/last)
        FIRST_BC,    ///< imposed first derivative at corresponding endpoint (left/right)
        SECOND_BC    ///< imposed second derivative at corresponding endpoint (left/right)
    };

    /// Construct a cubic spline y = y(t).
    /// It is assumed that the t values are sorted in ascending order.
    ChCubicSpline(const std::vector<double>& t, const std::vector<double>& y);

    /// Set the boundary condition at the left endpoint.
    /// The specified value is ignored if type = DEFAULT_BC.
    void SetLeftBC(BCType type, double val);

    /// Set the boundary condition at the right endpoint.
    /// The specified value is ignored if type = DEFAULT_BC.
    void SetRightBC(BCType type, double val);

    /// Evaluate the cubic spline at the specified value t.
    void Evaluate(double t, double& y, double& yp, double& ypp);

  private:
    void Process();

    bool m_process;

    BCType m_left_bc_type;
    BCType m_right_bc_type;

    double m_left_bc;
    double m_right_bc;

    std::vector<double> m_t;
    std::vector<double> m_y;
    std::vector<double> m_ypp;
}